

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.c
# Opt level: O1

void OpalOperator_ComputeRates(OpalOperator *self)

{
  ushort uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint uVar4;
  uint16_t uVar5;
  uint16_t *puVar6;
  uint uVar7;
  
  uVar1 = self->Chan->KeyScaleNumber >> (self->KeyScaleRate == 0) * '\x02';
  uVar7 = (uint)(uVar1 >> 2);
  uVar4 = uVar7 + self->AttackRate;
  uVar5 = (uint16_t)(1 << ((char)uVar4 - 0xcU & 0x1f));
  if (uVar4 < 0xc) {
    uVar5 = 1;
  }
  uVar2 = 0xc - (short)uVar4;
  if (0xc < uVar4) {
    uVar2 = 0;
  }
  puVar6 = (uint16_t *)((long)RateTables[0] + (ulong)((uVar1 & 3) << 4));
  self->AttackShift = uVar2;
  self->AttackMask = ~(ushort)(-1 << ((byte)uVar2 & 0x1f));
  self->AttackAdd = uVar5;
  self->AttackTab = puVar6;
  if (self->AttackRate == 0xf) {
    self->AttackAdd = 0xfff;
  }
  uVar4 = self->ReleaseRate + uVar7;
  uVar5 = (uint16_t)(1 << ((char)uVar4 - 0xcU & 0x1f));
  if (uVar4 < 0xc) {
    uVar5 = 1;
  }
  uVar7 = self->DecayRate + uVar7;
  uVar2 = (uint16_t)(1 << ((char)uVar7 - 0xcU & 0x1f));
  if (uVar7 < 0xc) {
    uVar2 = 1;
  }
  uVar3 = 0xc - (short)uVar7;
  if (0xc < uVar7) {
    uVar3 = 0;
  }
  self->DecayShift = uVar3;
  self->DecayMask = ~(ushort)(-1 << ((byte)uVar3 & 0x1f));
  self->DecayAdd = uVar2;
  self->DecayTab = puVar6;
  uVar2 = 0xc - (short)uVar4;
  if (0xc < uVar4) {
    uVar2 = 0;
  }
  self->ReleaseShift = uVar2;
  self->ReleaseMask = ~(ushort)(-1 << ((byte)uVar2 & 0x1f));
  self->ReleaseAdd = uVar5;
  self->ReleaseTab = puVar6;
  return;
}

Assistant:

static void OpalOperator_ComputeRates(OpalOperator *self)
{
    int combined_rate = self->AttackRate * 4 + (OpalChannel_GetKeyScaleNumber(self->Chan) >> (self->KeyScaleRate ? 0 : 2));
    int rate_high = combined_rate >> 2;
    int rate_low = combined_rate & 3;

    self->AttackShift = rate_high < 12 ? 12 - rate_high : 0;
    self->AttackMask = (1 << self->AttackShift) - 1;
    self->AttackAdd = (rate_high < 12) ? 1 : 1 << (rate_high - 12);
    self->AttackTab = RateTables[rate_low];

    /* Attack rate of 15 is always instant */
    if(self->AttackRate == 15)
        self->AttackAdd = 0xFFF;

    combined_rate = self->DecayRate * 4 + (OpalChannel_GetKeyScaleNumber(self->Chan) >> (self->KeyScaleRate ? 0 : 2));
    rate_high = combined_rate >> 2;
    rate_low = combined_rate & 3;

    self->DecayShift = rate_high < 12 ? 12 - rate_high : 0;
    self->DecayMask = (1 << self->DecayShift) - 1;
    self->DecayAdd = (rate_high < 12) ? 1 : 1 << (rate_high - 12);
    self->DecayTab = RateTables[rate_low];

    combined_rate = self->ReleaseRate * 4 + (OpalChannel_GetKeyScaleNumber(self->Chan) >> (self->KeyScaleRate ? 0 : 2));
    rate_high = combined_rate >> 2;
    rate_low = combined_rate & 3;

    self->ReleaseShift = rate_high < 12 ? 12 - rate_high : 0;
    self->ReleaseMask = (1 << self->ReleaseShift) - 1;
    self->ReleaseAdd = (rate_high < 12) ? 1 : 1 << (rate_high - 12);
    self->ReleaseTab = RateTables[rate_low];
}